

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_sec(secp256k1_context *ctx,uchar *seckey,secp256k1_keypair *keypair)

{
  secp256k1_keypair *keypair_local;
  uchar *seckey_local;
  secp256k1_context *ctx_local;
  
  if (seckey == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"seckey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    memset(seckey,0,0x20);
    if (keypair == (secp256k1_keypair *)0x0) {
      secp256k1_callback_call(&ctx->illegal_callback,"keypair != NULL");
      ctx_local._4_4_ = 0;
    }
    else {
      *(undefined8 *)seckey = *(undefined8 *)keypair->data;
      *(undefined8 *)(seckey + 8) = *(undefined8 *)(keypair->data + 8);
      *(undefined8 *)(seckey + 0x10) = *(undefined8 *)(keypair->data + 0x10);
      *(undefined8 *)(seckey + 0x18) = *(undefined8 *)(keypair->data + 0x18);
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_keypair_sec(const secp256k1_context* ctx, unsigned char *seckey, const secp256k1_keypair *keypair) {
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    memset(seckey, 0, 32);
    ARG_CHECK(keypair != NULL);

    memcpy(seckey, &keypair->data[0], 32);
    return 1;
}